

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Buffer.cc
# Opt level: O2

void __thiscall Pl_Buffer::~Pl_Buffer(Pl_Buffer *this)

{
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_Buffer_002ac258;
  std::unique_ptr<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>::~unique_ptr
            (&this->m);
  Pipeline::~Pipeline(&this->super_Pipeline);
  return;
}

Assistant:

Pl_Buffer::~Pl_Buffer() = default;